

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::HardSwish_x86_avx512::forward_inplace
          (HardSwish_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  int iVar5;
  _func_int **pp_Var6;
  _func_int *p_Var7;
  undefined1 auVar8 [32];
  uint uVar9;
  uint uVar10;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  long lVar11;
  undefined1 (*pauVar12) [64];
  int iVar13;
  uint uVar14;
  long lVar15;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  float fVar26;
  
  iVar5 = bottom_top_blob->c;
  if (0 < (long)iVar5) {
    uVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    pp_Var6 = this->_vptr_HardSwish_x86_avx512;
    lVar11 = 0;
    auVar18 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar21._8_4_ = 0x3f800000;
    auVar21._0_8_ = 0x3f8000003f800000;
    auVar21._12_4_ = 0x3f800000;
    auVar21._16_4_ = 0x3f800000;
    auVar21._20_4_ = 0x3f800000;
    auVar21._24_4_ = 0x3f800000;
    auVar21._28_4_ = 0x3f800000;
    auVar22._8_4_ = 0x3f800000;
    auVar22._0_8_ = 0x3f8000003f800000;
    auVar22._12_4_ = 0x3f800000;
    do {
      pauVar12 = (undefined1 (*) [64])
                 (bottom_top_blob->cstep * lVar11 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar9 < 0x10) {
        uVar14 = 0;
      }
      else {
        iVar13 = 0xf;
        do {
          auVar19 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd0 + (long)pp_Var6[-3])));
          uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var6[-3]);
          auVar20._4_4_ = uVar1;
          auVar20._0_4_ = uVar1;
          auVar20._8_4_ = uVar1;
          auVar20._12_4_ = uVar1;
          auVar20._16_4_ = uVar1;
          auVar20._20_4_ = uVar1;
          auVar20._24_4_ = uVar1;
          auVar20._28_4_ = uVar1;
          auVar20._32_4_ = uVar1;
          auVar20._36_4_ = uVar1;
          auVar20._40_4_ = uVar1;
          auVar20._44_4_ = uVar1;
          auVar20._48_4_ = uVar1;
          auVar20._52_4_ = uVar1;
          auVar20._56_4_ = uVar1;
          auVar20._60_4_ = uVar1;
          auVar20 = vfmadd213ps_avx512f(auVar19,*pauVar12,auVar20);
          auVar20 = vmaxps_avx512f(auVar20,ZEXT1664(ZEXT816(0) << 0x40));
          auVar20 = vminps_avx512f(auVar20,auVar18);
          auVar20 = vmulps_avx512f(auVar20,*pauVar12);
          *pauVar12 = auVar20;
          pauVar12 = pauVar12 + 1;
          iVar13 = iVar13 + 0x10;
          uVar14 = uVar9 & 0xfffffff0;
        } while (iVar13 < (int)uVar9);
      }
      uVar10 = uVar14 | 7;
      while ((int)uVar10 < (int)uVar9) {
        uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var6[-3]);
        auVar25._4_4_ = uVar1;
        auVar25._0_4_ = uVar1;
        auVar25._8_4_ = uVar1;
        auVar25._12_4_ = uVar1;
        auVar25._16_4_ = uVar1;
        auVar25._20_4_ = uVar1;
        auVar25._24_4_ = uVar1;
        auVar25._28_4_ = uVar1;
        auVar4 = *(undefined1 (*) [32])*pauVar12;
        uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var6[-3]);
        auVar17._4_4_ = uVar1;
        auVar17._0_4_ = uVar1;
        auVar17._8_4_ = uVar1;
        auVar17._12_4_ = uVar1;
        auVar17._16_4_ = uVar1;
        auVar17._20_4_ = uVar1;
        auVar17._24_4_ = uVar1;
        auVar17._28_4_ = uVar1;
        auVar17 = vfmadd213ps_avx512vl(auVar25,auVar4,auVar17);
        auVar17 = vmaxps_avx(auVar17,ZEXT1632(ZEXT816(0) << 0x40));
        auVar17 = vminps_avx(auVar17,auVar21);
        auVar8._4_4_ = auVar17._4_4_ * auVar4._4_4_;
        auVar8._0_4_ = auVar17._0_4_ * auVar4._0_4_;
        auVar8._8_4_ = auVar17._8_4_ * auVar4._8_4_;
        auVar8._12_4_ = auVar17._12_4_ * auVar4._12_4_;
        auVar8._16_4_ = auVar17._16_4_ * auVar4._16_4_;
        auVar8._20_4_ = auVar17._20_4_ * auVar4._20_4_;
        auVar8._24_4_ = auVar17._24_4_ * auVar4._24_4_;
        auVar8._28_4_ = auVar17._28_4_;
        *(undefined1 (*) [32])*pauVar12 = auVar8;
        pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x20);
        uVar10 = uVar14 + 0xf;
        uVar14 = uVar14 + 8;
      }
      uVar10 = uVar14 | 3;
      while ((int)uVar10 < (int)uVar9) {
        uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var6[-3]);
        auVar23._4_4_ = uVar1;
        auVar23._0_4_ = uVar1;
        auVar23._8_4_ = uVar1;
        auVar23._12_4_ = uVar1;
        auVar3 = *(undefined1 (*) [16])*pauVar12;
        uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var6[-3]);
        auVar16._4_4_ = uVar1;
        auVar16._0_4_ = uVar1;
        auVar16._8_4_ = uVar1;
        auVar16._12_4_ = uVar1;
        auVar16 = vfmadd213ps_avx512vl(auVar23,auVar3,auVar16);
        auVar16 = vmaxps_avx(auVar16,ZEXT816(0) << 0x40);
        auVar16 = vminps_avx(auVar16,auVar22);
        auVar24._0_4_ = auVar16._0_4_ * auVar3._0_4_;
        auVar24._4_4_ = auVar16._4_4_ * auVar3._4_4_;
        auVar24._8_4_ = auVar16._8_4_ * auVar3._8_4_;
        auVar24._12_4_ = auVar16._12_4_ * auVar3._12_4_;
        *(undefined1 (*) [16])*pauVar12 = auVar24;
        pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x10);
        uVar10 = uVar14 + 7;
        uVar14 = uVar14 + 4;
      }
      if (uVar9 - uVar14 != 0 && (int)uVar14 <= (int)uVar9) {
        lVar15 = 0;
        do {
          fVar2 = *(float *)(*pauVar12 + lVar15 * 4);
          p_Var7 = pp_Var6[-3];
          fVar26 = 0.0;
          if (fVar2 < *(float *)(&this->field_0xd8 + (long)p_Var7)) {
LAB_00510196:
            *(float *)(*pauVar12 + lVar15 * 4) = fVar26;
          }
          else if (fVar2 <= *(float *)(&this->field_0xdc + (long)p_Var7)) {
            auVar3 = vfmadd213ss_fma(ZEXT416(*(uint *)(&this->field_0xd0 + (long)p_Var7)),
                                     ZEXT416((uint)fVar2),
                                     ZEXT416(*(uint *)(&this->field_0xd4 + (long)p_Var7)));
            fVar26 = auVar3._0_4_ * fVar2;
            goto LAB_00510196;
          }
          lVar15 = lVar15 + 1;
        } while (uVar9 - uVar14 != (int)lVar15);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar5);
  }
  return 0;
}

Assistant:

int HardSwish_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _ans = _mm512_mul_ps(_ans, _p);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _ans = _mm_mul_ps(_ans, _p);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ptr++;
        }
    }

    return 0;
}